

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tankmixmodel.cpp
# Opt level: O3

double __thiscall
TankMixModel::findFIFOQuality(TankMixModel *this,double vNet,double vIn,double wIn,SegPool *segPool)

{
  double dVar1;
  double dVar2;
  Segment *pSVar3;
  SystemError *this_00;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  
  if (0.0 < vIn) {
    pSVar3 = this->lastSeg;
    if ((pSVar3 == (Segment *)0x0) || (this->cTol <= ABS(pSVar3->c - wIn / vIn))) {
      pSVar3 = SegPool::getSegment(segPool,vIn,wIn / vIn);
      if (pSVar3 == (Segment *)0x0) {
        this_00 = (SystemError *)__cxa_allocate_exception(0x30);
        SystemError::SystemError(this_00,0);
        __cxa_throw(this_00,&SystemError::typeinfo,ENerror::~ENerror);
      }
      if (this->firstSeg == (Segment *)0x0) {
        this->firstSeg = pSVar3;
      }
      if (this->lastSeg != (Segment *)0x0) {
        this->lastSeg->next = pSVar3;
      }
      this->lastSeg = pSVar3;
    }
    else {
      pSVar3->v = pSVar3->v + vIn;
    }
  }
  dVar5 = vIn - vNet;
  if (0.0 < dVar5) {
    dVar6 = 0.0;
    dVar4 = 0.0;
    do {
      pSVar3 = this->firstSeg;
      if (pSVar3 == (Segment *)0x0) break;
      dVar1 = pSVar3->v;
      dVar7 = dVar5;
      if ((pSVar3 != this->lastSeg) && (dVar1 <= dVar5)) {
        dVar7 = dVar1;
      }
      dVar2 = pSVar3->c;
      dVar5 = dVar5 - dVar7;
      if (((dVar5 < 0.0) || (dVar7 < dVar1)) || (pSVar3->next == (Segment *)0x0)) {
        pSVar3->v = dVar1 - dVar7;
      }
      else {
        this->firstSeg = pSVar3->next;
        SegPool::freeSegment(segPool,pSVar3);
      }
      dVar6 = dVar6 + dVar7;
      dVar4 = dVar4 + dVar2 * dVar7;
    } while (0.0 < dVar5);
    if (0.0 < dVar6) {
      dVar4 = dVar4 / dVar6;
      goto LAB_0013acfc;
    }
  }
  if (this->firstSeg == (Segment *)0x0) {
    dVar4 = 0.0;
  }
  else {
    dVar4 = this->firstSeg->c;
  }
LAB_0013acfc:
  this->cTank = dVar4;
  return dVar4;
}

Assistant:

double TankMixModel::findFIFOQuality(double vNet, double vIn, double wIn,
                                     SegPool* segPool)
{
    // ... add new last segment for flow entering the tank
    if ( vIn > 0.0 )
    {
        // ... increase segment volume if inflow has same quality as segment
        double cIn = wIn / vIn;
        if ( lastSeg && abs(lastSeg->c - cIn ) < cTol ) lastSeg->v += vIn;

        // ... otherwise add a new last segment to the tank
        else
        {
            Segment* seg = segPool->getSegment(vIn, cIn);
            if ( seg == nullptr ) throw SystemError(SystemError::OUT_OF_MEMORY);
            if ( firstSeg == nullptr ) firstSeg = seg;
            if ( lastSeg ) lastSeg->next = seg;
            lastSeg = seg;
        }
    }

    // ... withdraw flow from first segment
    double vSum = 0.0;
    double wSum = 0.0;
    double vOut = vIn - vNet;
    while (vOut > 0.0)
    {
        Segment* seg = firstSeg;
        if ( seg == nullptr ) break;
        double vSeg = min(seg->v, vOut);
        if ( seg == lastSeg ) vSeg = vOut;
        vSum += vSeg;
        wSum += seg->c * vSeg;
        vOut -= vSeg;
        if ( vOut >= 0.0 && vSeg >= seg->v && seg->next )
        {
            firstSeg = seg->next;
            segPool->freeSegment(seg);
        }
        else seg->v -= vSeg;
    }

    // ... return average quality withdrawn from 1st segment
    if ( vSum > 0.0 ) cTank = wSum / vSum;
    else if ( firstSeg == nullptr ) cTank = 0.0;
    else  cTank = firstSeg->c;
    return cTank;
}